

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O0

void __thiscall unodb::detail::qsbr_epoch::dump(qsbr_epoch *this,ostream *os)

{
  ostream *this_00;
  ostream *os_local;
  qsbr_epoch *this_local;
  
  this_00 = std::operator<<(os,"epoch = ");
  std::ostream::operator<<(this_00,(ulong)this->epoch_val);
  assert_invariant(this);
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void detail::qsbr_epoch::dump(
    std::ostream &os) const {
  os << "epoch = " << static_cast<std::uint64_t>(epoch_val);
#ifndef NDEBUG
  assert_invariant();
#endif
}